

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
HdmiCecSimulationDataGenerator::GenVersionTransaction(HdmiCecSimulationDataGenerator *this)

{
  GenStartSeq(this);
  GenDataBlock(this,'\x03',false,true);
  AdvanceRand(this,0.2,0.8);
  if (this->mErrorType == ERR_WRONGEOM) {
    GenDataBlock(this,0x9f,false,true);
    this->mErrorType = ERR_NOERROR;
  }
  else {
    GenDataBlock(this,0x9f,true,true);
  }
  AdvanceRand(this,5.0,10.0);
  GenStartSeq(this);
  GenDataBlock(this,'0',false,true);
  AdvanceRand(this,0.2,0.8);
  GenDataBlock(this,0x9e,false,true);
  AdvanceRand(this,0.2,0.8);
  GenDataBlock(this,'\x04',true,true);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenVersionTransaction()
{
    // The TV asks Tuner1 for it's CEC version
    GenStartSeq();
    GenHeaderBlock( HdmiCec::DevAddress_TV, HdmiCec::DevAddress_Tuner1 );
    AdvanceRand( 0.2f, 0.8f );
    if( mErrorType == ERR_WRONGEOM )
    {
        GenDataBlock( HdmiCec::OpCode_GetCecVersion, false, true );
        mErrorType = ERR_NOERROR;
    }
    else
    {
        GenDataBlock( HdmiCec::OpCode_GetCecVersion, true, true );
    }

    // Tuner1 asks with a CecVersion opcode and 0x4 (CEC 1.3a) as a single operand
    AdvanceRand( 5.0f, 10.0f );
    GenStartSeq();
    GenHeaderBlock( HdmiCec::DevAddress_Tuner1, HdmiCec::DevAddress_TV );
    AdvanceRand( 0.2f, 0.8f );
    GenDataBlock( HdmiCec::OpCode_CecVersion, false, true );
    AdvanceRand( 0.2f, 0.8f );
    GenDataBlock( 0x4, true, true );
}